

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::AdvancedSyncVertexArray::Cleanup(AdvancedSyncVertexArray *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDisable(this_00,0x8c89);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,3,this->m_texture);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_position_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_color_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_element_buffer);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_store_program);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_copy_program);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_draw_program);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_attribless_vao);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_draw_vao);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisable(GL_RASTERIZER_DISCARD);
		glUseProgram(0);
		glDeleteTextures(3, m_texture);
		glDeleteBuffers(1, &m_position_buffer);
		glDeleteBuffers(1, &m_color_buffer);
		glDeleteBuffers(1, &m_element_buffer);
		glDeleteProgram(m_store_program);
		glDeleteProgram(m_copy_program);
		glDeleteProgram(m_draw_program);
		glDeleteVertexArrays(1, &m_attribless_vao);
		glDeleteVertexArrays(1, &m_draw_vao);
		return NO_ERROR;
	}